

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::ReadTag(char *p,uint32 *out,uint32 max_tag)

{
  uint res_00;
  uint uVar1;
  undefined4 in_EDX;
  uint *in_RSI;
  byte *in_RDI;
  pair<const_char_*,_unsigned_int> pVar2;
  pair<const_char_*,_unsigned_int> tmp;
  uint32 second;
  uint32 res;
  byte *local_8;
  
  uVar1 = (uint)*in_RDI;
  if (uVar1 < 0x80) {
    *in_RSI = uVar1;
    local_8 = in_RDI + 1;
  }
  else {
    res_00 = (uint)in_RDI[1];
    uVar1 = (res_00 - 1) * 0x80 + uVar1;
    if (res_00 < 0x80) {
      *in_RSI = uVar1;
      local_8 = in_RDI + 2;
    }
    else {
      pVar2 = ReadTagFallback((char *)CONCAT44(in_EDX,uVar1),res_00);
      local_8 = (byte *)pVar2.first;
      *in_RSI = pVar2.second;
    }
  }
  return (char *)local_8;
}

Assistant:

inline const char* ReadTag(const char* p, uint32* out, uint32 max_tag = 0) {
  uint32 res = static_cast<uint8>(p[0]);
  if (res < 128) {
    *out = res;
    return p + 1;
  }
  uint32 second = static_cast<uint8>(p[1]);
  res += (second - 1) << 7;
  if (second < 128) {
    *out = res;
    return p + 2;
  }
  auto tmp = ReadTagFallback(p, res);
  *out = tmp.second;
  return tmp.first;
}